

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fillpoints.cc
# Opt level: O0

void re2c::calc_fill(dfa_t *dfa,vector<bool,_std::allocator<bool>_> *trivial,
                    vector<unsigned_long,_std::allocator<unsigned_long>_> *fill,size_t i)

{
  size_t *psVar1;
  size_type i_00;
  const_reference cVar2;
  reference pvVar3;
  const_reference ppdVar4;
  ulong local_48;
  size_t max;
  size_t j;
  size_t c;
  size_t *arcs;
  size_t i_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *fill_local;
  vector<bool,_std::allocator<bool>_> *trivial_local;
  dfa_t *dfa_local;
  
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](fill,i);
  if (*pvVar3 == 0xfffffffffffffffe) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](fill,i);
    *pvVar3 = 0;
    ppdVar4 = std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::operator[]
                        (&dfa->states,i);
    psVar1 = (*ppdVar4)->arcs;
    for (j = 0; j < dfa->nchars; j = j + 1) {
      i_00 = psVar1[j];
      if (i_00 != 0xffffffffffffffff) {
        calc_fill(dfa,trivial,fill,i_00);
        local_48 = 1;
        cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](trivial,i_00);
        if (cVar2) {
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](fill,i_00)
          ;
          local_48 = *pvVar3 + 1;
        }
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](fill,i);
        if (*pvVar3 < local_48) {
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](fill,i);
          *pvVar3 = local_48;
        }
      }
    }
  }
  return;
}

Assistant:

static void calc_fill(
	const dfa_t &dfa,
	const std::vector<bool> &trivial,
	std::vector<size_t> &fill,
	size_t i)
{
	if (fill[i] == UNDEFINED)
	{
		fill[i] = 0;
		const size_t *arcs = dfa.states[i]->arcs;
		for (size_t c = 0; c < dfa.nchars; ++c)
		{
			const size_t j = arcs[c];
			if (j != dfa_t::NIL)
			{
				calc_fill(dfa, trivial, fill, j);
				size_t max = 1;
				if (trivial[j])
				{
					max += fill[j];
				}
				if (max > fill[i])
				{
					fill[i] = max;
				}
			}
		}
	}
}